

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void plot_masked_sprite_16px_right(tgestate_t *state,uint8_t x)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  byte *pbVar4;
  bool bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  long lVar11;
  byte bVar12;
  ulong uVar13;
  byte *pbVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  ulong uVar18;
  
  bVar10 = x & 3;
  puVar2 = state->bitmap_pointer;
  puVar3 = state->mask_pointer;
  uVar1 = (state->spriteplotter).height_16_left;
  lVar11 = 0;
  do {
    bVar6 = puVar2[lVar11 * 2];
    bVar17 = puVar2[lVar11 * 2 + 1];
    bVar9 = puVar3[lVar11 * 2];
    bVar8 = puVar3[lVar11 * 2 + 1];
    if ((char)state->sprite_index < '\0') {
      uVar13 = (ulong)bVar6;
      uVar18 = (ulong)bVar9;
      bVar9 = state->reversed[bVar8];
      bVar8 = state->reversed[uVar18];
      bVar6 = state->reversed[bVar17];
      bVar17 = state->reversed[uVar13];
    }
    if (bVar10 == 3) {
      bVar7 = bVar8 << 7 | 0x7f;
      bVar8 = bVar9 << 7 | bVar8 >> 1;
      bVar9 = bVar9 >> 1 | 0x80;
LAB_0010a73e:
      bVar7 = bVar7 >> 1 | bVar8 << 7;
      bVar5 = true;
      bVar8 = bVar9 << 7 | bVar8 >> 1;
      bVar9 = bVar9 >> 1 | 0x80;
    }
    else {
      bVar7 = 0xff;
      if ((bVar10 ^ 2) < 2) goto LAB_0010a73e;
      bVar5 = false;
    }
    if (bVar10 == 0) {
      uVar13 = 0;
    }
    else {
      bVar15 = bVar9 >> 1 | 0x80;
      bVar9 = bVar9 << 7 | bVar8 >> 1;
      bVar7 = bVar8 << 7 | bVar7 >> 1;
      bVar8 = bVar9;
      bVar9 = bVar15;
      if (bVar10 == 3) {
        bVar15 = bVar6 << 7;
        bVar6 = bVar6 >> 1;
        uVar13 = (ulong)(byte)(bVar17 << 7);
        bVar17 = bVar15 | bVar17 >> 1;
      }
      else {
        uVar13 = 0;
      }
    }
    bVar15 = bVar6;
    bVar16 = bVar17;
    if (bVar5) {
      bVar15 = bVar6 >> 1;
      bVar16 = bVar6 << 7 | bVar17 >> 1;
      uVar13 = (ulong)(byte)(bVar17 << 7 | (byte)(uVar13 >> 1));
    }
    bVar12 = (byte)uVar13;
    bVar6 = bVar15;
    bVar17 = bVar16;
    if (bVar10 != 0) {
      bVar6 = bVar15 >> 1;
      bVar17 = bVar15 << 7 | bVar16 >> 1;
      bVar12 = bVar16 << 7 | (byte)(uVar13 >> 1);
    }
    pbVar4 = state->foreground_mask_pointer;
    pbVar14 = state->window_buf_pointer;
    if ((state->spriteplotter).enable_16_left_1 != '\0') {
      *pbVar14 = bVar6 & *pbVar4 | (bVar9 | ~*pbVar4) & *pbVar14;
    }
    if ((state->spriteplotter).enable_16_left_2 != '\0') {
      pbVar14[1] = bVar17 & pbVar4[1] | (bVar8 | ~pbVar4[1]) & pbVar14[1];
    }
    pbVar14 = pbVar14 + 2;
    if ((state->spriteplotter).enable_16_left_3 != '\0') {
      *pbVar14 = bVar12 & pbVar4[2] | (bVar7 | ~pbVar4[2]) & *pbVar14;
    }
    state->foreground_mask_pointer = pbVar4 + 4;
    state->window_buf_pointer = pbVar14 + (long)state->columns + -2;
    lVar11 = lVar11 + 1;
    if (uVar1 == (uint8_t)lVar11) {
      return;
    }
  } while( true );
}

Assistant:

void plot_masked_sprite_16px_right(tgestate_t *state, uint8_t x)
{
  uint8_t        iters;       /* was B */
  const uint8_t *maskptr;     /* was HL' */
  const uint8_t *bitmapptr;   /* was HL */
  const uint8_t *foremaskptr; /* was HL */
  uint8_t       *screenptr;   /* was HL */

  assert(state != NULL);
  assert(x < 4);

  ASSERT_MASK_BUF_PTR_VALID(state->foreground_mask_pointer);

  x = (~x & 3); /* jump table offset (on input, x is 0..3) */

  maskptr   = state->mask_pointer;
  bitmapptr = state->bitmap_pointer;

  assert(maskptr   != NULL);
  assert(bitmapptr != NULL);

  iters = state->spriteplotter.height_16_left; /* self modified by $E49D (setup_vischar_plotting) */
  assert(iters <= MASK_BUFFER_HEIGHT * 8);

  ASSERT_WINDOW_BUF_PTR_VALID(state->window_buf_pointer, 2);
  ASSERT_WINDOW_BUF_PTR_VALID(state->window_buf_pointer + (iters - 1) * state->columns + 2 - 1, 2);
  do
  {
    uint8_t bm0, bm1, bm2;       /* was D, E, C */
    uint8_t mask0, mask1, mask2; /* was D', E', C' */
    int     carry = 0;

    /* Load bitmap bytes into D,E. */
    bm0 = *bitmapptr++;
    bm1 = *bitmapptr++;

    /* Load mask bytes into D',E'. */
    mask0 = *maskptr++;
    mask1 = *maskptr++;

    if (state->sprite_index & sprite_FLAG_FLIP)
      flip_16_masked_pixels(state, &mask0, &mask1, &bm0, &bm1);

    foremaskptr = state->foreground_mask_pointer;
    ASSERT_MASK_BUF_PTR_VALID(foremaskptr);

    /* In the 24 pixel-wide plotter it does bitmap rotates THEN mask rotates.
     * Is this the opposite way around to save a bank switch? */

    /* Shift mask bytes */

    mask2 = 0xFF; /* all bits set => mask off */
    carry = 1; /* mask off */
    /* Conv: Replaced self-modified goto with if-else chain. */
    if (x <= 0)
    {
      RR(mask0);
      RR(mask1);
      RR(mask2);
    }
    if (x <= 1)
    {
      RR(mask0);
      RR(mask1);
      RR(mask2);
    }
    if (x <= 2)
    {
      RR(mask0);
      RR(mask1);
      RR(mask2);
    }

    /* Shift bitmap bytes */

    bm2 = 0; /* all bits clear => pixels off */
    //carry = 0; in original code but never read in practice
    /* Conv: Replaced self-modified goto with if-else chain. */
    if (x <= 0)
    {
      SRL(bm0);
      RR(bm1);
      RR(bm2);
    }
    if (x <= 1)
    {
      SRL(bm0);
      RR(bm1);
      RR(bm2);
    }
    if (x <= 2)
    {
      SRL(bm0);
      RR(bm1);
      RR(bm2);
    }

    /* Plot, using foreground mask. */

    screenptr = state->window_buf_pointer; // line moved relative to the 24 version
    ASSERT_WINDOW_BUF_PTR_VALID(screenptr, 2);
    ASSERT_MASK_BUF_PTR_VALID(foremaskptr);

    /* Conv: We form 'mask' inside of the enable_* condition. The original
     * game got away with accessing out-of-bounds memory but we can't. */

    if (state->spriteplotter.enable_16_left_1)
      *screenptr = MASK(bm0, mask0);
    foremaskptr++;
    screenptr++;

    if (state->spriteplotter.enable_16_left_2)
      *screenptr = MASK(bm1, mask1);
    foremaskptr++;
    screenptr++;

    if (state->spriteplotter.enable_16_left_3)
      *screenptr = MASK(bm2, mask2);
    foremaskptr += 2;
    state->foreground_mask_pointer = foremaskptr;

    screenptr += state->columns - 2; /* was 22 */
    if (iters > 1)
      ASSERT_WINDOW_BUF_PTR_VALID(screenptr, 2);
    state->window_buf_pointer = screenptr;
  }
  while (--iters);
}